

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O3

void __thiscall CDBBatch::Write<unsigned_char,uint256>(CDBBatch *this,uchar *key,uint256 *value)

{
  DataStream *ssValue;
  pointer pbVar1;
  long in_FS_OFFSET;
  Span<const_std::byte> key_00;
  uchar local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
            (&(this->ssKey).vch,(this->ssKey).m_read_pos + 0x40);
  ssValue = &this->ssValue;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
            (&ssValue->vch,(this->ssValue).m_read_pos + 0x400);
  local_31 = *key;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&this->ssKey,
             (this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish,&local_31);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)ssValue,
             (this->ssValue).vch.
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,value,value + 1);
  key_00.m_data =
       (this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
       _M_impl.super__Vector_impl_data._M_start + (this->ssKey).m_read_pos;
  key_00.m_size =
       (long)(this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)key_00.m_data;
  WriteImpl(this,key_00,ssValue);
  pbVar1 = (this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
      .super__Vector_impl_data._M_finish != pbVar1) {
    (this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar1;
  }
  (this->ssKey).m_read_pos = 0;
  pbVar1 = (this->ssValue).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->ssValue).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
      _M_impl.super__Vector_impl_data._M_finish != pbVar1) {
    (this->ssValue).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
    .super__Vector_impl_data._M_finish = pbVar1;
  }
  (this->ssValue).m_read_pos = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Write(const K& key, const V& value)
    {
        ssKey.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssValue.reserve(DBWRAPPER_PREALLOC_VALUE_SIZE);
        ssKey << key;
        ssValue << value;
        WriteImpl(ssKey, ssValue);
        ssKey.clear();
        ssValue.clear();
    }